

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::BindingModel::anon_unknown_1::ImageFetchComputeInstance::testResourceAccess
          (TestStatus *__return_storage_ptr__,ImageFetchComputeInstance *this)

{
  deUint32 dVar1;
  VkDescriptorPool pool;
  DeviceInterface *pDVar2;
  VkDevice pVVar3;
  VkQueue pVVar4;
  RefData<vk::Handle<(vk::HandleType)19>_> data;
  RefData<vk::Handle<(vk::HandleType)21>_> data_00;
  RefData<vk::Handle<(vk::HandleType)22>_> data_01;
  bool bVar5;
  Handle<(vk::HandleType)21> *pHVar6;
  Handle<(vk::HandleType)19> *pHVar7;
  ProgramCollection<vk::ProgramBinary> *programCollection;
  Handle<(vk::HandleType)22> *pHVar8;
  VkBufferMemoryBarrier *postBarriers_00;
  Handle<(vk::HandleType)32> *pHVar9;
  deUint8 *rawUpdateData;
  TestContext *pTVar10;
  TestLog *pTVar11;
  MessageBuilder *pMVar12;
  Vector<float,_4> *local_728;
  bool local_6f9;
  allocator<char> local_6b9;
  string local_6b8;
  MessageBuilder local_698;
  allocator<char> local_511;
  string local_510;
  undefined4 local_4f0;
  allocator<char> local_4e9;
  string local_4e8;
  MessageBuilder local_4c8;
  Vector<float,_4> local_348;
  Vector<float,_4> local_338;
  Vector<bool,_4> local_328;
  Vector<float,_4> local_324;
  undefined1 local_314 [8];
  Vec4 conversionThreshold;
  Vec4 reference;
  Vec4 result;
  int resultNdx;
  VkDescriptorSet local_2d8;
  VkDescriptorUpdateTemplateKHR local_2d0;
  deUint64 local_2c8;
  VkDescriptorSetLayout local_2c0;
  VkDescriptorSet local_2b8;
  byte local_2aa;
  byte local_2a9;
  undefined1 local_2a8 [6];
  bool allResultsOk;
  bool anyResultSet;
  Vec4 results [4];
  Vector<unsigned_int,_3> local_25c;
  VkPipelineLayout local_250;
  VkPipeline local_248;
  undefined1 local_240 [8];
  ComputeCommand compute;
  int numPostBarriers;
  VkBufferMemoryBarrier *postBarriers;
  int numPreBarriers;
  VkBufferMemoryBarrier *preBarriers;
  int numDynamicOffsets;
  deUint32 *dynamicOffsets;
  VkDescriptorSet VStack_1a0;
  int numDescriptorSets;
  VkDescriptorSet descriptorSets [1];
  ComputePipeline pipeline;
  Move<vk::Handle<(vk::HandleType)22>_> local_148;
  RefData<vk::Handle<(vk::HandleType)22>_> local_128;
  undefined1 local_108 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> descriptorSet;
  RefData<vk::Handle<(vk::HandleType)21>_> local_c8;
  undefined1 local_a8 [8];
  Unique<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  Move<vk::Handle<(vk::HandleType)19>_> local_78;
  RefData<vk::Handle<(vk::HandleType)19>_> local_58;
  undefined1 local_38 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  ImageFetchComputeInstance *this_local;
  
  descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)this;
  createDescriptorSetLayout(&local_78,this);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_58,(Move *)&local_78);
  data.deleter.m_deviceIface = local_58.deleter.m_deviceIface;
  data.object.m_internal = local_58.object.m_internal;
  data.deleter.m_device._0_4_ = (int)local_58.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_58.deleter.m_device >> 0x20);
  data.deleter.m_allocator = local_58.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_38,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_78);
  createDescriptorPool
            ((Move<vk::Handle<(vk::HandleType)21>_> *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool,
             this);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_c8,
             (Move *)&descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                      m_pool);
  data_00.deleter.m_deviceIface = local_c8.deleter.m_deviceIface;
  data_00.object.m_internal = local_c8.object.m_internal;
  data_00.deleter.m_device._0_4_ = (int)local_c8.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_c8.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator = local_c8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_a8,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)21>_> *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_a8);
  pool.m_internal = pHVar6->m_internal;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_38);
  createDescriptorSet(&local_148,this,pool,(VkDescriptorSetLayout)pHVar7->m_internal);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_128,(Move *)&local_148);
  data_01.deleter.m_deviceIface = local_128.deleter.m_deviceIface;
  data_01.object.m_internal = local_128.object.m_internal;
  data_01.deleter.m_device._0_4_ = (int)local_128.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_128.deleter.m_device >> 0x20);
  data_01.deleter.m_pool.m_internal = local_128.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_108,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_148);
  pDVar2 = this->m_vki;
  pVVar3 = this->m_device;
  programCollection = Context::getBinaryCollection((this->super_TestInstance).m_context);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::get
                     ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_38);
  ComputePipeline::ComputePipeline
            ((ComputePipeline *)descriptorSets,pDVar2,pVVar3,programCollection,1,pHVar7);
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_108);
  VStack_1a0.m_internal = pHVar8->m_internal;
  local_6f9 = true;
  if (this->m_updateMethod != DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE) {
    local_6f9 = this->m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH;
  }
  postBarriers_00 = ComputeInstanceResultBuffer::getResultReadBarrier(&this->m_result);
  compute.m_postBarriers._4_4_ = 1;
  pDVar2 = this->m_vki;
  pVVar3 = this->m_device;
  local_248 = ComputePipeline::getPipeline((ComputePipeline *)descriptorSets);
  local_250 = ComputePipeline::getPipelineLayout((ComputePipeline *)descriptorSets);
  tcu::Vector<unsigned_int,_3>::Vector(&local_25c,4,1,1);
  ComputeCommand::ComputeCommand
            ((ComputeCommand *)local_240,pDVar2,pVVar3,local_248,local_250,&local_25c,
             (byte)~local_6f9 & 1,&stack0xfffffffffffffe60,0,(deUint32 *)0x0,0,
             (VkBufferMemoryBarrier *)0x0,1,postBarriers_00);
  local_728 = (Vector<float,_4> *)local_2a8;
  do {
    tcu::Vector<float,_4>::Vector(local_728);
    local_728 = local_728 + 1;
  } while (local_728 != (Vector<float,_4> *)(results[3].m_data + 2));
  local_2a9 = 0;
  local_2aa = 1;
  if (this->m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE) {
    ::vk::Handle<(vk::HandleType)22>::Handle(&local_2b8,0);
    pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                       ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_38);
    local_2c0.m_internal = pHVar7->m_internal;
    local_2c8 = (deUint64)ComputePipeline::getPipelineLayout((ComputePipeline *)descriptorSets);
    writeDescriptorSetWithTemplate(this,local_2b8,local_2c0,true,(VkPipelineLayout)local_2c8);
    dVar1 = this->m_queueFamilyIndex;
    pVVar4 = this->m_queue;
    pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)32>_>::operator*
                       (&(this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>);
    local_2d0.m_internal = pHVar9->m_internal;
    rawUpdateData = RawUpdateRegistry::getRawPointer(&this->m_updateRegistry);
    ComputeCommand::submitAndWait((ComputeCommand *)local_240,dVar1,pVVar4,local_2d0,rawUpdateData);
  }
  else if (this->m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH) {
    ::vk::Handle<(vk::HandleType)22>::Handle(&local_2d8,0);
    writeDescriptorSet(this,local_2d8);
    ComputeCommand::submitAndWait
              ((ComputeCommand *)local_240,this->m_queueFamilyIndex,this->m_queue,
               &this->m_updateBuilder);
  }
  else {
    dVar1 = this->m_queueFamilyIndex;
    pVVar4 = this->m_queue;
    ::vk::Handle<(vk::HandleType)32>::Handle((Handle<(vk::HandleType)32> *)(result.m_data + 3),0);
    ComputeCommand::submitAndWait
              ((ComputeCommand *)local_240,dVar1,pVVar4,stack0xfffffffffffffd20,(void *)0x0);
  }
  ComputeInstanceResultBuffer::readResultContentsTo(&this->m_result,(Vec4 (*) [4])local_2a8);
  for (result.m_data[2] = 0.0; (int)result.m_data[2] < 4;
      result.m_data[2] = (float)((int)result.m_data[2] + 1)) {
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(reference.m_data + 2),
               (Vector<float,_4> *)(local_2a8 + (long)(int)result.m_data[2] * 0x10));
    ImageFetchInstanceImages::fetchImageValue
              ((ImageFetchInstanceImages *)(conversionThreshold.m_data + 2),(int)this + 0xe8);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_314,0.003921569);
    tcu::Vector<float,_4>::Vector(&local_324,-1.0);
    bVar5 = tcu::Vector<float,_4>::operator!=((Vector<float,_4> *)(reference.m_data + 2),&local_324)
    ;
    if (bVar5) {
      local_2a9 = 1;
    }
    tcu::operator-((tcu *)&local_348,(Vector<float,_4> *)(reference.m_data + 2),
                   (Vector<float,_4> *)(conversionThreshold.m_data + 2));
    tcu::abs<float,4>((tcu *)&local_338,&local_348);
    tcu::greaterThan<float,4>((tcu *)&local_328,&local_338,(Vector<float,_4> *)local_314);
    bVar5 = tcu::boolAny<4>(&local_328);
    if (bVar5) {
      local_2aa = 0;
      pTVar10 = Context::getTestContext((this->super_TestInstance).m_context);
      pTVar11 = tcu::TestContext::getLog(pTVar10);
      tcu::TestLog::operator<<(&local_4c8,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<(&local_4c8,(char (*) [13])"Test sample ");
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(int *)(result.m_data + 2));
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [12])": Expected ");
      pMVar12 = tcu::MessageBuilder::operator<<
                          (pMVar12,(Vector<float,_4> *)(conversionThreshold.m_data + 2));
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [7])0x134ad58);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(Vector<float,_4> *)(reference.m_data + 2));
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_4c8);
    }
  }
  if ((local_2aa & 1) == 0) {
    if ((local_2a9 & 1) == 0) {
      pTVar10 = Context::getTestContext((this->super_TestInstance).m_context);
      pTVar11 = tcu::TestContext::getLog(pTVar10);
      tcu::TestLog::operator<<(&local_698,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<
                          (&local_698,(char (*) [34])"Result buffer was not written to.");
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_698);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6b8,"Result buffer was not written to",&local_6b9);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_6b8);
      std::__cxx11::string::~string((string *)&local_6b8);
      std::allocator<char>::~allocator(&local_6b9);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_510,"Invalid result values",&local_511);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_510);
      std::__cxx11::string::~string((string *)&local_510);
      std::allocator<char>::~allocator(&local_511);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,"Pass",&local_4e9);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_4e8);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::allocator<char>::~allocator(&local_4e9);
  }
  local_4f0 = 1;
  ComputePipeline::~ComputePipeline((ComputePipeline *)descriptorSets);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_108);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_a8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus ImageFetchComputeInstance::testResourceAccess (void)
{
	const vk::Unique<vk::VkDescriptorSetLayout>		descriptorSetLayout	(createDescriptorSetLayout());
	const vk::Unique<vk::VkDescriptorPool>			descriptorPool		(createDescriptorPool());
	const vk::Unique<vk::VkDescriptorSet>			descriptorSet		(createDescriptorSet(*descriptorPool, *descriptorSetLayout));
	const ComputePipeline							pipeline			(m_vki, m_device, m_context.getBinaryCollection(), 1, &descriptorSetLayout.get());

	const vk::VkDescriptorSet						descriptorSets[]	= { *descriptorSet };
	const int										numDescriptorSets	= (m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE || m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH) ? 0 : DE_LENGTH_OF_ARRAY(descriptorSets);
	const deUint32* const							dynamicOffsets		= DE_NULL;
	const int										numDynamicOffsets	= 0;
	const vk::VkBufferMemoryBarrier* const			preBarriers			= DE_NULL;
	const int										numPreBarriers		= 0;
	const vk::VkBufferMemoryBarrier* const			postBarriers		= m_result.getResultReadBarrier();
	const int										numPostBarriers		= 1;

	const ComputeCommand							compute				(m_vki,
																		 m_device,
																		 pipeline.getPipeline(),
																		 pipeline.getPipelineLayout(),
																		 tcu::UVec3(4, 1, 1),
																		 numDescriptorSets,	descriptorSets,
																		 numDynamicOffsets,	dynamicOffsets,
																		 numPreBarriers,	preBarriers,
																		 numPostBarriers,	postBarriers);

	tcu::Vec4										results[4];
	bool											anyResultSet		= false;
	bool											allResultsOk		= true;

	if (m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE)
	{
		writeDescriptorSetWithTemplate(DE_NULL, *descriptorSetLayout, true, pipeline.getPipelineLayout());
		compute.submitAndWait(m_queueFamilyIndex, m_queue, *m_updateTemplate, (const void*) m_updateRegistry.getRawPointer());
	}
	else if (m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH)
	{
		writeDescriptorSet(DE_NULL);
		compute.submitAndWait(m_queueFamilyIndex, m_queue, m_updateBuilder);
	}
	else
	{
		compute.submitAndWait(m_queueFamilyIndex, m_queue);
	}
	m_result.readResultContentsTo(&results);

	// verify
	for (int resultNdx = 0; resultNdx < 4; ++resultNdx)
	{
		const tcu::Vec4	result				= results[resultNdx];
		const tcu::Vec4	reference			= m_images.fetchImageValue(resultNdx);
		const tcu::Vec4	conversionThreshold	= tcu::Vec4(1.0f / 255.0f);

		if (result != tcu::Vec4(-1.0f))
			anyResultSet = true;

		if (tcu::boolAny(tcu::greaterThan(tcu::abs(result - reference), conversionThreshold)))
		{
			allResultsOk = false;

			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "Test sample " << resultNdx << ": Expected " << reference << ", got " << result
				<< tcu::TestLog::EndMessage;
		}
	}

	// read back and verify
	if (allResultsOk)
		return tcu::TestStatus::pass("Pass");
	else if (anyResultSet)
		return tcu::TestStatus::fail("Invalid result values");
	else
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "Result buffer was not written to."
			<< tcu::TestLog::EndMessage;
		return tcu::TestStatus::fail("Result buffer was not written to");
	}
}